

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_init(Curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  Curl_hash_dtor dtor)

{
  Curl_llist *pCVar1;
  int local_3c;
  int i;
  Curl_hash_dtor dtor_local;
  comp_function comparator_local;
  hash_function hfunc_local;
  int slots_local;
  Curl_hash *h_local;
  
  if ((((slots == 0) || (hfunc == (hash_function)0x0)) || (comparator == (comp_function)0x0)) ||
     (dtor == (Curl_hash_dtor)0x0)) {
    h_local._4_4_ = 1;
  }
  else {
    h->hash_func = hfunc;
    h->comp_func = comparator;
    h->dtor = dtor;
    h->size = 0;
    h->slots = slots;
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)((long)slots << 5);
    h->table = pCVar1;
    if (h->table == (Curl_llist *)0x0) {
      h->slots = 0;
      h_local._4_4_ = 1;
    }
    else {
      for (local_3c = 0; local_3c < slots; local_3c = local_3c + 1) {
        Curl_llist_init(h->table + local_3c,hash_element_dtor);
      }
      h_local._4_4_ = 0;
    }
  }
  return h_local._4_4_;
}

Assistant:

int
Curl_hash_init(struct Curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               Curl_hash_dtor dtor)
{
  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct Curl_llist));
  if(h->table) {
    int i;
    for(i = 0; i < slots; ++i)
      Curl_llist_init(&h->table[i], (Curl_llist_dtor) hash_element_dtor);
    return 0; /* fine */
  }
  h->slots = 0;
  return 1; /* failure */
}